

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<long>::MultAdd
          (TPZFMatrix<long> *this,TPZFMatrix<long> *x,TPZFMatrix<long> *y,TPZFMatrix<long> *z,
          long alpha,long beta,int opt)

{
  _func_int **pp_Var1;
  int64_t iVar2;
  int64_t iVar3;
  TPZFMatrix<long> *pTVar4;
  int64_t iVar5;
  long *plVar6;
  TPZFMatrix<long> *in_RCX;
  long *plVar7;
  TPZFMatrix<long> *in_RDX;
  TPZFMatrix<long> *in_RSI;
  TPZBaseMatrix *in_RDI;
  long in_R8;
  long in_R9;
  int in_stack_00000008;
  char *in_stack_00000078;
  long *xlast;
  long *xp_1;
  long val;
  long *zp_2;
  long *fp_1;
  long *xp;
  long *fp;
  long *zlast_1;
  long *zp_1;
  int64_t i;
  long *yp;
  long *zlast;
  long *zp;
  int64_t c;
  int64_t ic;
  int64_t xcols;
  int64_t cols;
  int64_t rows;
  uint numeq;
  ulong local_140;
  int64_t in_stack_fffffffffffffed0;
  int64_t in_stack_fffffffffffffed8;
  TPZFMatrix<long> *in_stack_fffffffffffffee0;
  long *local_c0;
  long local_b8;
  long *local_b0;
  _func_int **local_a8;
  _func_int **local_98;
  long *local_88;
  long local_80;
  long *local_68;
  long local_60;
  long local_58;
  
  if (in_stack_00000008 == 0) {
    iVar2 = TPZBaseMatrix::Cols(in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 != iVar3) goto LAB_0120cdb1;
  }
  if (in_stack_00000008 != 0) {
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
    if (iVar2 != iVar3) {
LAB_0120cdb1:
      Error((char *)xlast,in_stack_00000078);
      return;
    }
  }
  if (in_R9 != 0) {
    if (in_stack_00000008 == 0) {
      iVar2 = TPZBaseMatrix::Rows(in_RDI);
      iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDX);
      if (iVar2 != iVar3) goto LAB_0120ce67;
    }
    if (in_stack_00000008 != 0) {
      iVar2 = TPZBaseMatrix::Cols(in_RDI);
      iVar3 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDX);
      if (iVar2 != iVar3) goto LAB_0120ce67;
    }
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDX);
    iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    if (iVar2 != iVar3) {
LAB_0120ce67:
      Error((char *)xlast,in_stack_00000078);
      return;
    }
  }
  if (in_stack_00000008 == 0) {
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RCX);
    iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    if (iVar2 == iVar3) {
      iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RCX);
      iVar3 = TPZBaseMatrix::Rows(in_RDI);
      if (iVar2 == iVar3) goto LAB_0120cfb3;
    }
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    (*(in_RCX->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
              (in_RCX,iVar2,iVar3);
  }
  else {
    in_stack_fffffffffffffee0 = (TPZFMatrix<long> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RCX);
    pTVar4 = (TPZFMatrix<long> *)TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    if (in_stack_fffffffffffffee0 == pTVar4) {
      in_stack_fffffffffffffed8 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RCX);
      iVar2 = TPZBaseMatrix::Cols(in_RDI);
      if (in_stack_fffffffffffffed8 == iVar2) goto LAB_0120cfb3;
    }
    in_stack_fffffffffffffed0 = TPZBaseMatrix::Cols(in_RDI);
    iVar2 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    (*(in_RCX->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
              (in_RCX,in_stack_fffffffffffffed0,iVar2);
  }
LAB_0120cfb3:
  iVar2 = TPZBaseMatrix::Cols(in_RDI);
  if (iVar2 == 0) {
    (*(in_RCX->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])();
  }
  if (in_stack_00000008 == 0) {
    local_140 = TPZBaseMatrix::Rows(in_RDI);
  }
  else {
    local_140 = TPZBaseMatrix::Cols(in_RDI);
  }
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  iVar3 = TPZBaseMatrix::Cols(in_RDI);
  iVar5 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  if ((int)local_140 != 0) {
    for (local_58 = 0; local_58 < iVar5; local_58 = local_58 + 1) {
      local_68 = operator()(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                            in_stack_fffffffffffffed0);
      plVar6 = local_68 + (local_140 & 0xffffffff);
      if (in_R9 == 0) {
        for (; local_68 != plVar6; local_68 = local_68 + 1) {
          *local_68 = 0;
        }
      }
      else {
        plVar6 = g(in_RDX,0,local_58);
        if (in_RCX != in_RDX) {
          memcpy(local_68,plVar6,(local_140 & 0xffffffff) << 3);
        }
        for (local_80 = 0; local_80 < (long)(local_140 & 0xffffffff); local_80 = local_80 + 1) {
          plVar6 = operator()(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                              in_stack_fffffffffffffed0);
          *plVar6 = in_R9 * *plVar6;
        }
      }
    }
  }
  if (iVar2 * iVar3 != 0) {
    for (local_58 = 0; local_58 < iVar5; local_58 = local_58 + 1) {
      if (in_stack_00000008 == 0) {
        for (local_60 = 0; local_60 < iVar3; local_60 = local_60 + 1) {
          local_88 = operator()(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                                in_stack_fffffffffffffed0);
          plVar7 = local_88 + iVar2;
          pp_Var1 = in_RDI[1].super_TPZSavable._vptr_TPZSavable;
          plVar6 = g(in_RSI,local_60,local_58);
          local_98 = pp_Var1 + iVar2 * local_60;
          for (; local_88 < plVar7; local_88 = local_88 + 1) {
            *local_88 = in_R8 * (long)*local_98 * *plVar6 + *local_88;
            local_98 = local_98 + 1;
          }
        }
      }
      else {
        local_a8 = in_RDI[1].super_TPZSavable._vptr_TPZSavable;
        local_b0 = operator()(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                              in_stack_fffffffffffffed0);
        for (local_60 = 0; local_60 < iVar3; local_60 = local_60 + 1) {
          local_b8 = 0;
          local_c0 = g(in_RSI,0,local_58);
          plVar6 = local_c0 + iVar2;
          for (; local_c0 < plVar6; local_c0 = local_c0 + 1) {
            local_b8 = (long)*local_a8 * *local_c0 + local_b8;
            local_a8 = local_a8 + 1;
          }
          *local_b0 = in_R8 * local_b8 + *local_b0;
          local_b0 = local_b0 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta,const int opt) const {
    
    if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && this->Rows() != y.Rows()) || (opt && this->Cols() != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != this->Rows()) {
            z.Redim(this->Rows(),x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != this->Cols()) {
            z.Redim(this->Cols(),x.Cols());
        }
    }
    if(this->Cols() == 0)
    {
        z.Zero();
    }
    unsigned numeq = opt ? this->Cols() : this->Rows();
    int64_t rows = this->Rows();
    int64_t cols = this->Cols();
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if (numeq)
    {
        for (ic = 0; ic < xcols; ic++) {
            TVar *zp = &z(0,ic), *zlast = zp+numeq;
            if(beta != (TVar)0.) {
                const TVar *yp = &y.g(0,ic);
                if(&z != &y) {
                    memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
                }
                for(int64_t i=0; i< numeq; i++) z(i,ic) *= beta;
                
            } else {
                while(zp != zlast) {
                    *zp = 0.;
                    zp ++;
                }
            }
        }
    }
    
    if(!(rows*cols)) return;
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                TVar * fp = fElem +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            TVar * fp = fElem,  *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
}